

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O1

int legendre_symbol(int q,int p)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  char *pcVar6;
  int iVar7;
  int iVar8;
  bool bVar9;
  double dVar10;
  int aiStack_288 [2];
  int pstack [50];
  int aiStack_1b8 [2];
  int qstack [50];
  int local_e8 [2];
  int factor [20];
  int power [20];
  int local_40;
  int local_3c;
  int nfactor;
  int nleft;
  int p_local;
  
  nfactor = q;
  nleft = p;
  if (p < 2) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"LEGENDRE_SYMBOL - Fatal error!\n");
    pcVar6 = "  P must be greater than 1.\n";
LAB_001d142d:
    std::operator<<((ostream *)&std::cerr,pcVar6);
    exit(1);
  }
  if (3 < p) {
    dVar10 = (double)p;
    if (dVar10 < 0.0) {
      dVar10 = sqrt(dVar10);
    }
    else {
      dVar10 = SQRT(dVar10);
    }
    if (1 < (int)dVar10) {
      uVar5 = 2;
      do {
        iVar7 = (int)((ulong)(uint)p % uVar5);
        if ((int)dVar10 == (int)uVar5) break;
        uVar5 = (ulong)((int)uVar5 + 1);
      } while (iVar7 != 0);
      if (iVar7 == 0) {
        std::operator<<((ostream *)&std::cerr,"\n");
        std::operator<<((ostream *)&std::cerr,"LEGENDRE_SYMBOL - Fatal error!\n");
        pcVar6 = "  P is not prime.\n";
        goto LAB_001d142d;
      }
    }
  }
  if (nfactor % nleft == 0) {
    iVar7 = 0;
  }
  else {
    iVar7 = 1;
    if (nleft != 2) {
      iVar8 = 0;
      if (0 < nfactor) {
        iVar8 = nfactor;
      }
      nfactor = ((uint)((iVar8 - nfactor) + (nfactor >> 0x1f)) / (nleft + (uint)(nleft == 0)) -
                (nfactor >> 0x1f)) * nleft + nfactor;
      iVar8 = 0;
      while( true ) {
        nfactor = nfactor % nleft;
        i4_factor(nfactor,0x14,&local_40,local_e8,factor + 0x12,&local_3c);
        iVar1 = nleft;
        if (local_3c != 1) break;
        lVar2 = (long)local_40;
        if (lVar2 < 1) {
          bVar9 = true;
        }
        else {
          lVar3 = 0;
          iVar4 = 0;
          do {
            if ((factor[lVar3 + 0x12] & 0x80000001U) == 1) {
              if (0x31 < iVar8) {
                std::operator<<((ostream *)&std::cerr,"\n");
                std::operator<<((ostream *)&std::cerr,"LEGENDRE_SYMBOL - Fatal error!\n");
                pcVar6 = "  Stack overflow!\n";
                goto LAB_001d142d;
              }
              iVar4 = iVar4 + 1;
              aiStack_288[iVar8] = iVar1;
              aiStack_1b8[iVar8] = local_e8[lVar3];
              iVar8 = iVar8 + 1;
            }
            lVar3 = lVar3 + 1;
          } while (lVar2 != lVar3);
          bVar9 = iVar4 == 0;
        }
        if (bVar9) {
LAB_001d1396:
          if (iVar8 == 0) {
            return iVar7;
          }
          nleft = aiStack_288[(long)iVar8 + -1];
          nfactor = pstack[(long)iVar8 + 0x31];
          iVar8 = iVar8 + -1;
        }
        else {
          lVar2 = (long)iVar8;
          iVar8 = iVar8 + -1;
          nfactor = pstack[lVar2 + 0x31];
          if (nfactor == 1) goto LAB_001d1396;
          if (nfactor == 2) {
            if ((nleft % 8 != 1) && (nleft % 8 != 7)) {
              if ((nleft % 8 != 5) && (nleft % 8 != 3)) goto LAB_001d13ba;
              iVar7 = -iVar7;
            }
            goto LAB_001d1396;
          }
LAB_001d13ba:
          if ((nfactor & 0x80000003U) == 3 && (nleft & 0x80000003U) == 3) {
            iVar7 = -iVar7;
          }
          i4_swap(&nleft,&nfactor);
        }
      }
      std::operator<<((ostream *)&std::cerr,"\n");
      std::operator<<((ostream *)&std::cerr,"LEGENDRE_SYMBOL - Fatal error!\n");
      pcVar6 = "  Not enough factorization space.\n";
      goto LAB_001d142d;
    }
  }
  return iVar7;
}

Assistant:

int legendre_symbol ( int q, int p )

//****************************************************************************80
//
//  Purpose:
//
//    LEGENDRE_SYMBOL evaluates the Legendre symbol (Q/P).
//
//  Definition:
//
//    Let P be an odd prime.  Q is a QUADRATIC RESIDUE modulo P
//    if there is an integer R such that R^2 = Q ( mod P ).
//    The Legendre symbol ( Q / P ) is defined to be:
//
//      + 1 if Q ( mod P ) /= 0 and Q is a quadratic residue modulo P,
//      - 1 if Q ( mod P ) /= 0 and Q is not a quadratic residue modulo P,
//        0 if Q ( mod P ) == 0.
//
//    We can also define ( Q / P ) for P = 2 by:
//
//      + 1 if Q ( mod P ) /= 0
//        0 if Q ( mod P ) == 0
//
//  Example:
//
//    (0/7) =   0
//    (1/7) = + 1  ( 1^2 = 1 mod 7 )
//    (2/7) = + 1  ( 3^2 = 2 mod 7 )
//    (3/7) = - 1
//    (4/7) = + 1  ( 2^2 = 4 mod 7 )
//    (5/7) = - 1
//    (6/7) = - 1
//
//  Discussion:
//
//    For any prime P, exactly half of the integers from 1 to P-1
//    are quadratic residues.
//
//    ( 0 / P ) = 0.
//
//    ( Q / P ) = ( mod ( Q, P ) / P ).
//
//    ( Q / P ) = ( Q1 / P ) * ( Q2 / P ) if Q = Q1 * Q2.
//
//    If Q is prime, and P is prime and greater than 2, then:
//
//      if ( Q == 1 ) then
//
//        ( Q / P ) = 1
//
//      else if ( Q == 2 ) then
//
//        ( Q / P ) = + 1 if mod ( P, 8 ) = 1 or mod ( P, 8 ) = 7,
//        ( Q / P ) = - 1 if mod ( P, 8 ) = 3 or mod ( P, 8 ) = 5.
//
//      else
//
//        ( Q / P ) = - ( P / Q ) if Q = 3 ( mod 4 ) and P = 3 ( mod 4 ),
//                  =   ( P / Q ) otherwise.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    28 March 2001
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Charles Pinter,
//    A Book of Abstract Algebra,
//    McGraw Hill, 1982, pages 236-237.
//
//    Daniel Zwillinger,
//    CRC Standard Mathematical Tables and Formulae,
//    30th Edition,
//    CRC Press, 1996, pages 86-87.
//
//  Parameters:
//
//    Input, int Q, an integer whose Legendre symbol with
//    respect to P is desired.
//
//    Input, int P, a prime number, greater than 1, with respect
//    to which the Legendre symbol of Q is desired.
//
//    Output, int LEGENDRE_SYMBOL, the Legendre symbol (Q/P).
//    Ordinarily, this will be -1, 0 or 1.
//    L = -2, P is less than or equal to 1.
//    L = -3, P is not prime.
//    L = -4, the internal stack of factors overflowed.
//    L = -5, not enough factorization space.
//
{
# define FACTOR_MAX 20
# define STACK_MAX 50

  int factor[FACTOR_MAX];
  int i;
  int l;
  int nfactor;
  int nleft;
  int nmore;
  int nstack;
  int power[FACTOR_MAX];
  int pstack[STACK_MAX];
  int qstack[STACK_MAX];
//
//  P must be greater than 1.
//
  if ( p <= 1 )
  {
    std::cerr << "\n";
    std::cerr << "LEGENDRE_SYMBOL - Fatal error!\n";
    std::cerr << "  P must be greater than 1.\n";
    exit ( 1 );
  }
//
//  P must be prime.
//
  if ( !( i4_is_prime ( p ) ) )
  {
    std::cerr << "\n";
    std::cerr << "LEGENDRE_SYMBOL - Fatal error!\n";
    std::cerr << "  P is not prime.\n";
    exit ( 1 );
  }
//
//  ( k*P / P ) = 0.
//
  if ( ( q % p ) == 0 )
  {
    return 0;
  }
//
//  For the special case P = 2, (Q/P) = 1 for all odd numbers.
//
  if ( p == 2 )
  {
    return 1;
  }
//
//  Force Q to be nonnegative.
//
  while ( q < 0 )
  {
    q = q + p;
  }

  nstack = 0;
  l = 1;

  for ( ; ; )
  {
    q = q % p;
//
//  Decompose Q into factors of prime powers.
//
    i4_factor ( q, FACTOR_MAX, nfactor, factor, power, nleft );

    if ( nleft != 1 )
    {
      std::cerr << "\n";
      std::cerr << "LEGENDRE_SYMBOL - Fatal error!\n";
      std::cerr << "  Not enough factorization space.\n";
      exit ( 1 );
    }
//
//  Each factor which is an odd power is added to the stack.
//
    nmore = 0;

    for ( i = 0; i < nfactor; i++ )
    {
      if ( ( power[i] % 2 ) == 1 )
      {
        nmore = nmore + 1;

        if ( STACK_MAX <= nstack )
        {
          std::cerr << "\n";
          std::cerr << "LEGENDRE_SYMBOL - Fatal error!\n";
          std::cerr << "  Stack overflow!\n";
          exit ( 1 );
        }

        pstack[nstack] = p;
        qstack[nstack] = factor[i];
        nstack = nstack + 1;
      }

    }

    if ( nmore != 0 )
    {
      nstack = nstack - 1;
      q = qstack[nstack];
//
//  Check for a Q of 1 or 2.
//
      if ( q == 1 )
      {
        l = + 1 * l;
      }
      else if ( q == 2 && ( ( p % 8 ) == 1 || ( p % 8 ) == 7 ) )
      {
        l = + 1 * l;
      }
      else if ( q == 2 && ( ( p % 8 ) == 3 || ( p % 8 ) == 5 ) )
      {
        l = - 1 * l;
      }
      else
      {
        if ( ( p % 4 ) == 3 && ( q % 4 ) == 3 )
        {
          l = - 1 * l;
        }

        i4_swap ( &p, &q );

        continue;

      }

    }
//
//  If the stack is empty, we're done.
//
    if ( nstack == 0 )
    {
      break;
    }
//
//  Otherwise, get the last P and Q from the stack, and process them.
//
    nstack = nstack - 1;
    p = pstack[nstack];
    q = qstack[nstack];
  }

  return l;

# undef FACTOR_MAX
# undef STACK_MAX
}